

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O2

PhysicalIndex __thiscall
duckdb::LocalStorage::CreateOptimisticCollection
          (LocalStorage *this,DataTable *table,
          unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
          *collection)

{
  LocalTableStorage *this_00;
  PhysicalIndex PVar1;
  _Head_base<0UL,_duckdb::RowGroupCollection_*,_false> local_10;
  
  this_00 = LocalTableManager::GetOrCreateStorage(&this->table_manager,this->context,table);
  local_10._M_head_impl =
       (collection->
       super_unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>
       )._M_t.
       super___uniq_ptr_impl<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::RowGroupCollection_*,_std::default_delete<duckdb::RowGroupCollection>_>
       .super__Head_base<0UL,_duckdb::RowGroupCollection_*,_false>._M_head_impl;
  (collection->
  super_unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>).
  _M_t.
  super___uniq_ptr_impl<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::RowGroupCollection_*,_std::default_delete<duckdb::RowGroupCollection>_>
  .super__Head_base<0UL,_duckdb::RowGroupCollection_*,_false>._M_head_impl =
       (RowGroupCollection *)0x0;
  PVar1 = LocalTableStorage::CreateOptimisticCollection
                    (this_00,(unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
                              *)&local_10);
  ::std::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>::
  ~unique_ptr((unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>
               *)&local_10);
  return (PhysicalIndex)PVar1.index;
}

Assistant:

PhysicalIndex LocalStorage::CreateOptimisticCollection(DataTable &table, unique_ptr<RowGroupCollection> collection) {
	auto &storage = table_manager.GetOrCreateStorage(context, table);
	return storage.CreateOptimisticCollection(std::move(collection));
}